

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar_pre.h
# Opt level: O0

void __thiscall Logger::~Logger(Logger *this)

{
  int iVar1;
  ostream *this_00;
  Logger *this_local;
  
  depth_ = depth_ + -1;
  Indent(this);
  iVar1 = std::uncaught_exceptions();
  if (iVar1 < 1) {
    std::operator<<((ostream *)&std::cerr,"SUCCESS: ");
  }
  else {
    std::operator<<((ostream *)&std::cerr,"FAIL: ");
  }
  this_00 = std::operator<<((ostream *)&std::cerr,this->name_);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

~Logger() {
        --depth_;
        Indent();
        if (std::uncaught_exceptions() > 0) {
            std::cerr << "FAIL: ";
        } else {
            std::cerr << "SUCCESS: ";
        }
        std::cerr << name_ << std::endl;
    }